

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

void __thiscall ncnn::Convolution_x86::Convolution_x86(Convolution_x86 *this)

{
  undefined8 *in_RDI;
  Convolution *in_stack_fffffffffffffff0;
  
  Convolution::Convolution(in_stack_fffffffffffffff0);
  *in_RDI = 0x1dec60;
  in_RDI[0x20] = 0x1dece0;
  Mat::Mat((Mat *)(in_RDI + 3));
  Mat::Mat((Mat *)(in_RDI + 0xb));
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x1357c6);
  Mat::Mat((Mat *)(in_RDI + 0x18));
  in_RDI[1] = 0;
  in_RDI[0x16] = 0;
  return;
}

Assistant:

Convolution_x86::Convolution_x86()
{
    activation = 0;
    convolution_dilation1 = 0;
}